

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::computeQuadTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,Vec2 *bottomLeft,Vec2 *topRight)

{
  reference pvVar1;
  float fVar2;
  Vec2 *topRight_local;
  Vec2 *bottomLeft_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  std::vector<float,_std::allocator<float>_>::resize(dst,8);
  fVar2 = tcu::Vector<float,_2>::x(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::y(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::x(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::y(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::x(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::y(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::x(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::y(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  *pvVar1 = fVar2;
  return;
}

Assistant:

void computeQuadTexCoord2D (std::vector<float>& dst, const tcu::Vec2& bottomLeft, const tcu::Vec2& topRight)
{
	dst.resize(4*2);

	dst[0] = bottomLeft.x();	dst[1] = bottomLeft.y();
	dst[2] = bottomLeft.x();	dst[3] = topRight.y();
	dst[4] = topRight.x();		dst[5] = bottomLeft.y();
	dst[6] = topRight.x();		dst[7] = topRight.y();
}